

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O0

ostream * tcu::operator<<(ostream *stream,Vector<float,_3> *vec)

{
  int local_1c;
  int i;
  Vector<float,_3> *vec_local;
  ostream *stream_local;
  
  std::operator<<(stream,"(");
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    if (local_1c != 0) {
      std::operator<<(stream,", ");
    }
    std::ostream::operator<<(stream,vec->m_data[local_1c]);
  }
  std::operator<<(stream,")");
  return stream;
}

Assistant:

std::ostream& operator<< (std::ostream& stream, const tcu::Vector<T, Size>& vec)
{
	stream << "(";
	for (int i = 0; i < Size; i++)
	{
		if (i != 0)
			stream << ", ";
		stream << vec.m_data[i];
	}
	stream << ")";
	return stream;
}